

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util-json-write.hpp
# Opt level: O0

void __thiscall
mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::EnsureCanWrite
          (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *this)

{
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *this_local;
  
  switch(this->kind_) {
  case Unset:
    break;
  case Scalar:
    break;
  case Array:
  case Dict:
    break;
  case Closed:
  }
  return;
}

Assistant:

void MiniJSONWriter<StringWriter>::EnsureCanWrite() {
  switch (kind_) {
  case Kind::Unset:
    break;
  case Kind::Scalar:
    assert(0==n_written_);
    break;
  case Kind::Array:
  case Kind::Dict:
    break;
  case Kind::Closed:     // done already
    assert(false && "writing into closed MiniJSONWriter node");
    break;
  default:
    assert(false && "unknown MiniJSONWriter node kind");
    break;
  }
}